

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

JavascriptPromiseCapability *
Js::JavascriptPromise::NewPromiseCapability(Var constructor,ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *threadContext;
  JavascriptPromiseCapability *pJVar2;
  undefined1 local_30 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  RecyclableObject *constructorFunc;
  ScriptContext *scriptContext_local;
  Var constructor_local;
  
  bVar1 = Js::JavascriptOperators::IsConstructor(constructor);
  if (!bVar1) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec76,(PCWSTR)0x0);
  }
  autoReentrancyHandler._8_8_ = VarTo<Js::RecyclableObject>(constructor);
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_30,threadContext);
  pJVar2 = CreatePromiseCapabilityRecord
                     ((RecyclableObject *)autoReentrancyHandler._8_8_,scriptContext);
  AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_30);
  return pJVar2;
}

Assistant:

JavascriptPromiseCapability* JavascriptPromise::NewPromiseCapability(Var constructor, ScriptContext* scriptContext)
    {
        if (!JavascriptOperators::IsConstructor(constructor))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
        }

        RecyclableObject* constructorFunc = VarTo<RecyclableObject>(constructor);

        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            return CreatePromiseCapabilityRecord(constructorFunc, scriptContext);
        }
        END_SAFE_REENTRANT_CALL
    }